

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

void lws_cancel_service(lws_context *context)

{
  lws **pplVar1;
  short sVar2;
  
  if ((context->field_0x510 & 8) == 0) {
    sVar2 = context->count_threads;
    _lws_log(8,"%s\n","lws_cancel_service");
    if (sVar2 != 0) {
      pplVar1 = &context->pt[0].pipe_wsi;
      do {
        if (*pplVar1 != (lws *)0x0) {
          lws_plat_pipe_signal(*pplVar1);
        }
        sVar2 = sVar2 + -1;
        pplVar1 = pplVar1 + 0x31;
      } while (sVar2 != 0);
    }
  }
  return;
}

Assistant:

void
lws_cancel_service(struct lws_context *context)
{
	struct lws_context_per_thread *pt = &context->pt[0];
	short m = context->count_threads;

	if (context->being_destroyed1)
		return;

	lwsl_info("%s\n", __func__);

	while (m--) {
		if (pt->pipe_wsi)
			lws_plat_pipe_signal(pt->pipe_wsi);
		pt++;
	}
}